

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O0

int main(void)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  char *pcVar7;
  uint *puVar8;
  bool bVar9;
  uchar *data;
  nn_cmsghdr *cmsg;
  void *control;
  long lStack_160;
  uchar body [3];
  nn_iovec iovec;
  nn_msghdr hdr;
  undefined1 local_128 [4];
  int val;
  char buf [256];
  int i;
  int s2;
  int s1;
  int sc;
  int sb;
  int rc;
  
  iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                           ,0x34,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                    ,0x35,iVar2,"inproc://test");
  iVar3 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                           ,0x36,1,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                 ,0x37,iVar3,"inproc://test");
  iVar4 = nn_bind(iVar2,"inproc://test");
  bVar9 = false;
  if (iVar4 < 0) {
    piVar6 = __errno_location();
    bVar9 = *piVar6 == 0x62;
  }
  if (!bVar9) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0 && errno == EADDRINUSE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
            ,0x3b);
    fflush(_stderr);
    nn_err_abort();
  }
  buf[0xfc] = '\0';
  buf[0xfd] = '\0';
  buf[0xfe] = '\0';
  buf[0xff] = '\0';
  for (; buf._252_4_ != 100; buf._252_4_ = buf._252_4_ + 1) {
    test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                   ,0x40,iVar2,"ABC");
    test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                   ,0x41,iVar3,"ABC");
    test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                   ,0x42,iVar3,"DEFG");
    test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                   ,0x43,iVar2,"DEFG");
  }
  buf[0xfc] = '\0';
  buf[0xfd] = '\0';
  buf[0xfe] = '\0';
  buf[0xff] = '\0';
  for (; buf._252_4_ != 100; buf._252_4_ = buf._252_4_ + 1) {
    test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                   ,0x48,iVar2,"XYZ");
  }
  buf[0xfc] = '\0';
  buf[0xfd] = '\0';
  buf[0xfe] = '\0';
  buf[0xff] = '\0';
  for (; buf._252_4_ != 100; buf._252_4_ = buf._252_4_ + 1) {
    test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                   ,0x4b,iVar3,"XYZ");
  }
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                  ,0x4e,iVar2);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                  ,0x4f,iVar3);
  iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                           ,0x52,1,0x10);
  hdr.msg_controllen._4_4_ = 200;
  test_setsockopt_impl
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
             ,0x54,iVar2,0,3,(void *)((long)&hdr.msg_controllen + 4),4);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                 ,0x55,iVar2,"inproc://test");
  iVar3 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                           ,0x56,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                    ,0x57,iVar3,"inproc://test");
  hdr.msg_controllen._4_4_ = 200;
  test_setsockopt_impl
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
             ,0x5a,iVar3,0,4,(void *)((long)&hdr.msg_controllen + 4),4);
  buf[0xfc] = '\0';
  buf[0xfd] = '\0';
  buf[0xfe] = '\0';
  buf[0xff] = '\0';
  do {
    iVar4 = nn_send(iVar3,"0123456789",10,0);
    if (iVar4 < 0) {
      iVar5 = nn_errno();
      if (iVar5 == 0x6e) {
        if (buf._252_4_ != 0x14) {
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","i == 20",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                  ,100);
          fflush(_stderr);
          nn_err_abort();
        }
        test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                       ,0x65,iVar2,"0123456789");
        test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                       ,0x66,iVar3,"0123456789");
        iVar4 = nn_send(iVar3,"0123456789",10,0);
        bVar9 = false;
        if (iVar4 < 0) {
          iVar4 = nn_errno();
          bVar9 = iVar4 == 0x6e;
        }
        if (!bVar9) {
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0 && nn_errno () == ETIMEDOUT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                  ,0x68);
          fflush(_stderr);
          nn_err_abort();
        }
        buf[0xfc] = '\0';
        buf[0xfd] = '\0';
        buf[0xfe] = '\0';
        buf[0xff] = '\0';
        for (; buf._252_4_ != 0x14; buf._252_4_ = buf._252_4_ + 1) {
          test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                         ,0x6a,iVar2,"0123456789");
        }
        buf[0xfc] = '\0';
        buf[0xfd] = '\0';
        buf[0xfe] = '\0';
        buf[0xff] = '\0';
        for (; buf._252_4_ != 0x100; buf._252_4_ = buf._252_4_ + 1) {
          local_128[(int)buf._252_4_] = 0x41;
        }
        iVar4 = nn_send(iVar3,local_128,0x100,0);
        pFVar1 = _stderr;
        if (iVar4 < 0) {
          piVar6 = __errno_location();
          pcVar7 = nn_err_strerror(*piVar6);
          puVar8 = (uint *)__errno_location();
          fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar7,(ulong)*puVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                  ,0x72);
          fflush(_stderr);
          nn_err_abort();
        }
        if (iVar4 != 0x100) {
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 256",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                  ,0x73);
          fflush(_stderr);
          nn_err_abort();
        }
        iVar4 = nn_recv(iVar2,local_128,0x100,0);
        pFVar1 = _stderr;
        if (iVar4 < 0) {
          piVar6 = __errno_location();
          pcVar7 = nn_err_strerror(*piVar6);
          puVar8 = (uint *)__errno_location();
          fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar7,(ulong)*puVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                  ,0x75);
          fflush(_stderr);
          nn_err_abort();
        }
        if (iVar4 != 0x100) {
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 256",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                  ,0x76);
          fflush(_stderr);
          nn_err_abort();
        }
        test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                        ,0x78,iVar3);
        test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                        ,0x79,iVar2);
        iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                                 ,0x8a,2,0x31);
        test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                       ,0x8b,iVar2,"inproc://test");
        iVar3 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                                 ,0x8c,1,0x30);
        test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                          ,0x8d,iVar3,"inproc://test");
        test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                       ,0x8f,iVar3,"ABC");
        lStack_160 = (long)&control + 5;
        iovec.iov_base = (void *)0x3;
        iovec.iov_len = (size_t)&stack0xfffffffffffffea0;
        hdr.msg_iov._0_4_ = 1;
        hdr._8_8_ = &cmsg;
        hdr.msg_control = (void *)0xffffffffffffffff;
        iVar4 = nn_recvmsg(iVar2,&iovec.iov_len,0);
        pFVar1 = _stderr;
        if (iVar4 != 3) {
          piVar6 = __errno_location();
          pcVar7 = nn_err_strerror(*piVar6);
          puVar8 = (uint *)__errno_location();
          fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar7,(ulong)*puVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                  ,0x98);
          fflush(_stderr);
          nn_err_abort();
        }
        data = (uchar *)nn_cmsg_nxthdr_(&iovec.iov_len,0);
        while( true ) {
          if (data == (uchar *)0x0) {
            fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","cmsg",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                    ,0x9c);
            fflush(_stderr);
            nn_err_abort();
          }
          if ((*(int *)(data + 8) == 1) && (*(int *)(data + 0xc) == 1)) break;
          data = (uchar *)nn_cmsg_nxthdr_(&iovec.iov_len,data);
        }
        if (*(long *)data != 0x20) {
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                  "cmsg->cmsg_len == NN_CMSG_SPACE (8+sizeof (size_t))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                  ,0xa1);
          fflush(_stderr);
          nn_err_abort();
        }
        if ((data[0x18] & 0x80) != 0) {
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!(data[0+sizeof (size_t)] & 0x80)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                  ,0xa3);
          fflush(_stderr);
          nn_err_abort();
        }
        if ((data[0x1c] & 0x80) == 0) {
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","data[4+sizeof (size_t)] & 0x80",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                  ,0xa4);
          fflush(_stderr);
          nn_err_abort();
        }
        nn_freemsg(cmsg);
        test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                        ,0xa8,iVar3);
        test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                        ,0xa9,iVar2);
        iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                                 ,0xac,1,0x70);
        test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                       ,0xad,iVar2,"inproc://test");
        iVar3 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                                 ,0xaf,1,0x70);
        test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                          ,0xb0,iVar3,"inproc://test");
        iVar4 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                                 ,0xb2,1,0x70);
        test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                          ,0xb3,iVar4,"inproc://test");
        test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                        ,0xb6,iVar2);
        nn_sleep(100);
        iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                                 ,0xbb,1,0x70);
        test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                       ,0xbc,iVar2,"inproc://test");
        buf[0xfc] = '\0';
        buf[0xfd] = '\0';
        buf[0xfe] = '\0';
        buf[0xff] = '\0';
        for (; buf._252_4_ != 100; buf._252_4_ = buf._252_4_ + 1) {
          test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                         ,0xc1,iVar3,"ABC");
          test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                         ,0xc2,iVar4,"QRS");
          test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                         ,0xc3,iVar2,"ABC");
          test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                         ,0xc4,iVar2,"QRS");
          test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                         ,0xc5,iVar2,"DEFG");
          test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                         ,0xc6,iVar3,"DEFG");
          test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                         ,199,iVar4,"DEFG");
        }
        buf[0xfc] = '\0';
        buf[0xfd] = '\0';
        buf[0xfe] = '\0';
        buf[0xff] = '\0';
        for (; buf._252_4_ != 100; buf._252_4_ = buf._252_4_ + 1) {
          test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                         ,0xcc,iVar3,"XYZ");
        }
        buf[0xfc] = '\0';
        buf[0xfd] = '\0';
        buf[0xfe] = '\0';
        buf[0xff] = '\0';
        for (; buf._252_4_ != 100; buf._252_4_ = buf._252_4_ + 1) {
          test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                         ,0xcf,iVar2,"XYZ");
        }
        buf[0xfc] = '\0';
        buf[0xfd] = '\0';
        buf[0xfe] = '\0';
        buf[0xff] = '\0';
        for (; buf._252_4_ != 100; buf._252_4_ = buf._252_4_ + 1) {
          test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                         ,0xd2,iVar4,"MNO");
        }
        buf[0xfc] = '\0';
        buf[0xfd] = '\0';
        buf[0xfe] = '\0';
        buf[0xff] = '\0';
        for (; buf._252_4_ != 100; buf._252_4_ = buf._252_4_ + 1) {
          test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                         ,0xd5,iVar2,"MNO");
        }
        test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                        ,0xd8,iVar4);
        test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                        ,0xd9,iVar3);
        test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                        ,0xda,iVar2);
        return 0;
      }
    }
    pFVar1 = _stderr;
    if (iVar4 < 0) {
      piVar6 = __errno_location();
      pcVar7 = nn_err_strerror(*piVar6);
      puVar8 = (uint *)__errno_location();
      fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar7,(ulong)*puVar8,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
              ,0x60);
      fflush(_stderr);
      nn_err_abort();
    }
    if (iVar4 != 10) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 10",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
              ,0x61);
      fflush(_stderr);
      nn_err_abort();
    }
    buf._252_4_ = buf._252_4_ + 1;
  } while( true );
}

Assistant:

int main ()
{
    int rc;
    int sb;
    int sc;
    int s1, s2;
    int i;
    char buf [256];
    int val;
    struct nn_msghdr hdr;
    struct nn_iovec iovec;
    unsigned char body [3];
    void *control;
    struct nn_cmsghdr *cmsg;
    unsigned char *data;

    /*  Create a simple topology. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);

    /*  Try a duplicate bind. It should fail. */
    rc = nn_bind (sc, SOCKET_ADDRESS);
    nn_assert (rc < 0 && errno == EADDRINUSE);

    /*  Ping-pong test. */
    for (i = 0; i != 100; ++i) {

        test_send (sc, "ABC");
        test_recv (sb, "ABC");
        test_send (sb, "DEFG");
        test_recv (sc, "DEFG");
    }

    /*  Batch transfer test. */
    for (i = 0; i != 100; ++i) {
        test_send (sc, "XYZ");
    }
    for (i = 0; i != 100; ++i) {
        test_recv (sb, "XYZ");
    }

    test_close (sc);
    test_close (sb);

    /*  Test whether queue limits are observed. */
    sb = test_socket (AF_SP, NN_PAIR);
    val = 200;
    test_setsockopt (sb, NN_SOL_SOCKET, NN_RCVBUF, &val, sizeof (val));
    test_bind (sb, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);

    val = 200;
    test_setsockopt (sc, NN_SOL_SOCKET, NN_SNDTIMEO, &val, sizeof (val));
    i = 0;
    while (1) {
        rc = nn_send (sc, "0123456789", 10, 0);
        if (rc < 0 && nn_errno () == ETIMEDOUT)
            break;
        errno_assert (rc >= 0);
        nn_assert (rc == 10);
        ++i;
    }
    nn_assert (i == 20);
    test_recv (sb, "0123456789");
    test_send (sc, "0123456789");
    rc = nn_send (sc, "0123456789", 10, 0);
    nn_assert (rc < 0 && nn_errno () == ETIMEDOUT);
    for (i = 0; i != 20; ++i) {
        test_recv (sb, "0123456789");
    }

    /*  Make sure that even a message that doesn't fit into the buffers
        gets across. */
    for (i = 0; i != sizeof (buf); ++i)
        buf [i] = 'A';
    rc = nn_send (sc, buf, 256, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);
    rc = nn_recv (sb, buf, sizeof (buf), 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);

    test_close (sc);
    test_close (sb);

#if 0
    /*  Test whether connection rejection is handled decently. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    s1 = test_socket (AF_SP, NN_PAIR);
    test_connect (s1, SOCKET_ADDRESS);
    s2 = test_socket (AF_SP, NN_PAIR);
    test_connect (s2, SOCKET_ADDRESS);
    nn_sleep (100);
    test_close (s2);
    test_close (s1);
    test_close (sb);
#endif

    /* Check whether SP message header is transferred correctly. */
    sb = test_socket (AF_SP_RAW, NN_REP);
    test_bind (sb, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_REQ);
    test_connect (sc, SOCKET_ADDRESS);

    test_send (sc, "ABC");

    iovec.iov_base = body;
    iovec.iov_len = sizeof (body);
    hdr.msg_iov = &iovec;
    hdr.msg_iovlen = 1;
    hdr.msg_control = &control;
    hdr.msg_controllen = NN_MSG;
    rc = nn_recvmsg (sb, &hdr, 0);
    errno_assert (rc == 3);

    cmsg = NN_CMSG_FIRSTHDR (&hdr);
    while (1) {
        nn_assert (cmsg);
        if (cmsg->cmsg_level == PROTO_SP && cmsg->cmsg_type == SP_HDR)
            break;
        cmsg = NN_CMSG_NXTHDR (&hdr, cmsg);
    }
    nn_assert (cmsg->cmsg_len == NN_CMSG_SPACE (8+sizeof (size_t)));
    data = NN_CMSG_DATA (cmsg);
    nn_assert (!(data[0+sizeof (size_t)] & 0x80));
    nn_assert (data[4+sizeof (size_t)] & 0x80);

    nn_freemsg (control);

    test_close (sc);
    test_close (sb);

    /* Test binding a new socket after originally bound socket shuts down. */
    sb = test_socket (AF_SP, NN_BUS);
    test_bind (sb, SOCKET_ADDRESS);

    sc = test_socket (AF_SP, NN_BUS);
    test_connect (sc, SOCKET_ADDRESS);

    s1 = test_socket (AF_SP, NN_BUS);
    test_connect (s1, SOCKET_ADDRESS);

    /* Close bound socket, leaving connected sockets connect. */
    test_close (sb);

    nn_sleep (100);

    /* Rebind a new socket to the address to which our connected sockets are listening. */
    s2 = test_socket (AF_SP, NN_BUS);
    test_bind (s2, SOCKET_ADDRESS);

    /*  Ping-pong test. */
    for (i = 0; i != 100; ++i) {

        test_send (sc, "ABC");
        test_send (s1, "QRS");
        test_recv (s2, "ABC");
        test_recv (s2, "QRS");
        test_send (s2, "DEFG");
        test_recv (sc, "DEFG");
        test_recv (s1, "DEFG");
    }

    /*  Batch transfer test. */
    for (i = 0; i != 100; ++i) {
        test_send (sc, "XYZ");
    }
    for (i = 0; i != 100; ++i) {
        test_recv (s2, "XYZ");
    }
    for (i = 0; i != 100; ++i) {
        test_send (s1, "MNO");
    }
    for (i = 0; i != 100; ++i) {
        test_recv (s2, "MNO");
    }

    test_close (s1);
    test_close (sc);
    test_close (s2);

    return 0;
}